

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  uint uVar1;
  word wVar2;
  OrphanBuilder local_38;
  
  uVar1 = truncate(this,__file,0);
  wVar2.content = (ulong)uVar1;
  if ((char)uVar1 == '\0') {
    initStructList(&local_38,(BuilderArena *)(this->segment->super_SegmentReader).arena,
                   this->capTable,(ElementCount)__file,SUB84(__length,0));
    if (this->segment != (SegmentBuilder *)0x0) {
      euthanize(this);
    }
    this->segment = local_38.segment;
    this->capTable = local_38.capTable;
    this->location = local_38.location;
    (this->tag).content = local_38.tag.content;
    wVar2.content = local_38.tag.content;
  }
  return (int)wVar2.content;
}

Assistant:

void OrphanBuilder::truncate(ElementCount size, StructSize elementSize) {
  if (!truncate(size, false)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initStructList(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size), elementSize);
  }
}